

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

string * __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
        *this,int indent)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  reference pptVar5;
  int in_EDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  char cVar6;
  string *in_RDI;
  string_t *in_stack_00000078;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  child_tags_list_t *__range4;
  string_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  const_iterator __end0;
  const_iterator __begin0;
  values_vector_t *__range3;
  string_t *result;
  string_t *in_stack_fffffffffffffe78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe80;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffe90;
  allocator *paVar7;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe98;
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  tag_t<cfgfile::string_trait_t> *local_d0;
  tag_t<cfgfile::string_trait_t> **local_c8;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_c0;
  undefined8 local_b8;
  string local_b0 [32];
  string local_90 [32];
  reference local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  tag_t<cfgfile::string_trait_t> *local_58;
  allocator local_49;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffe98);
  cVar6 = const_t<cfgfile::string_trait_t>::c_tab;
  if (bVar2) {
    uVar4 = (ulong)local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,uVar4,cVar6,&local_49);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    cVar6 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar6);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::append(in_RDI);
    local_58 = in_RSI + 1;
    local_60._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe78);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe78);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffe80,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe78), bVar2) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_60);
      std::__cxx11::string::push_back(cVar6);
      format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
      ::to_string(in_stack_fffffffffffffe78);
      to_cfgfile_format<cfgfile::string_trait_t>(in_stack_00000078);
      std::__cxx11::string::operator=(local_90,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string(local_90);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_60);
    }
    (*in_RSI->_vptr_tag_t[2])();
    bVar2 = std::
            vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ::empty(in_stack_fffffffffffffe90);
    if (!bVar2) {
      std::__cxx11::string::push_back(cVar6);
      iVar3 = (*in_RSI->_vptr_tag_t[2])();
      local_b8 = CONCAT44(extraout_var,iVar3);
      local_c0._M_current =
           (tag_t<cfgfile::string_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
           ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    *)in_stack_fffffffffffffe78);
      local_c8 = (tag_t<cfgfile::string_trait_t> **)
                 std::
                 vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                        *)in_stack_fffffffffffffe78);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffe78),
            cVar1 = const_t<cfgfile::string_trait_t>::c_tab, bVar2) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::operator*(&local_c0);
        local_d0 = *pptVar5;
        (*local_d0->_vptr_tag_t[3])(local_f0,local_d0,(ulong)(local_14 + 1));
        std::__cxx11::string::append(in_RDI);
        std::__cxx11::string::~string(local_f0);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::operator++(&local_c0);
      }
      uVar4 = (ulong)local_14;
      paVar7 = &local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,uVar4,cVar1,paVar7);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}